

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O2

void enhanceContrastLinearly
               (Image *src,Histogram *src_hist,Image *dest,int low,int high,int channel)

{
  byte bVar1;
  byte intensity;
  int iVar2;
  int iVar3;
  Pixel PVar4;
  Pixel *pPVar5;
  int x;
  uint x_00;
  byte intensity_00;
  int y;
  uint y_00;
  uchar local_44 [4];
  uchar local_40 [4];
  uchar local_3c [4];
  Image *local_38;
  
  if (((src == (Image *)0x0) || (src_hist == (Histogram *)0x0)) || (dest == (Image *)0x0)) {
    __assert_fail("(src != nullptr) && (src_hist != nullptr) && (dest != nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                  ,0x58,
                  "void enhanceContrastLinearly(const Image *, const Histogram *, Image *, int, int, int)"
                 );
  }
  checkDimensionsEqualOrThrow(src,dest);
  checkValidColorChannelOrThrow(channel);
  for (intensity_00 = 0; (int)(uint)intensity_00 < src_hist->range; intensity_00 = intensity_00 + 1)
  {
    iVar2 = Histogram::operator()(src_hist,intensity_00,channel);
    if (low < iVar2) break;
  }
  for (iVar2 = 0xff; intensity = (byte)iVar2, intensity_00 < intensity; iVar2 = iVar2 + -1) {
    iVar3 = Histogram::operator()(src_hist,intensity,channel);
    if (high < iVar3) break;
  }
  local_38 = src;
  for (y_00 = 0; y_00 < src->height; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < src->width; x_00 = x_00 + 1) {
      PVar4 = Image::operator()(src,x_00,y_00);
      local_3c[0] = PVar4.colors[0];
      local_3c[1] = PVar4.colors[1];
      local_3c[2] = PVar4.colors[2];
      local_3c[3] = PVar4.colors[3];
      if (local_3c[channel] < intensity_00) {
        pPVar5 = Image::operator()(dest,x_00,y_00);
        pPVar5->colors[channel] = '\0';
      }
      else {
        PVar4 = Image::operator()(src,x_00,y_00);
        local_40[0] = PVar4.colors[0];
        local_40[1] = PVar4.colors[1];
        local_40[2] = PVar4.colors[2];
        local_40[3] = PVar4.colors[3];
        if (intensity < local_40[channel]) {
          pPVar5 = Image::operator()(dest,x_00,y_00);
          pPVar5->colors[channel] = 0xff;
        }
        else {
          PVar4 = Image::operator()(src,x_00,y_00);
          local_44[0] = PVar4.colors[0];
          local_44[1] = PVar4.colors[1];
          local_44[2] = PVar4.colors[2];
          local_44[3] = PVar4.colors[3];
          bVar1 = local_44[channel];
          pPVar5 = Image::operator()(dest,x_00,y_00);
          pPVar5->colors[channel] =
               (uchar)(int)((float)(int)((uint)bVar1 - (uint)intensity_00) * 255.0 *
                           (1.0 / (float)(int)(iVar2 - (uint)intensity_00)));
          src = local_38;
        }
      }
    }
  }
  return;
}

Assistant:

void enhanceContrastLinearly(const Image *src, const Histogram *src_hist, Image *dest, int low, int high, int channel) {
  // Check arguments
  assert((src != nullptr) && (src_hist != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  unsigned char first = 0;
  unsigned char last = 255;

  // Obtain the first intensity that is above the threshold.
  for (first = 0; first < src_hist->range; first++) {
    if (src_hist->count(first, channel) > low) {
      break;
    }
  }

  // Obtain the first intensity that is above the threshold.
  for (last = 255; last > first; last--) {
    if (src_hist->count(last, channel) > high) {
      break;
    }
  }

  // Obtain the scaling factor and offset.
  float scale = 255.0f / (last - first);
  auto offset = first;

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Clamp anything above and below the threshold to 0...255
      if (src->pixel(x, y).colors[channel] < first) {
        dest->pixel(x, y).colors[channel] = 0;
      } else if (src->pixel(x, y).colors[channel] > last) {
        dest->pixel(x, y).colors[channel] = 255;
      } else {
        // Anything else is scaled
        dest->pixel(x, y).colors[channel] = (unsigned char) (scale * (src->pixel(x, y).colors[channel] - offset));
      }
    }
  }

}